

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_dec.c
# Opt level: O1

int pnm_getdata(jas_stream_t *in,pnm_hdr_t *hdr,jas_image_t *image,int allow_trunc)

{
  ushort uVar1;
  byte *pbVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  jas_matrix_t *pjVar8;
  ushort **ppuVar9;
  ulong uVar10;
  int *piVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  uint_fast32_t uv;
  uint_fast32_t local_b0;
  int local_a4;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  undefined8 local_80;
  long local_78;
  long local_70;
  int local_68;
  int local_64;
  int *local_60;
  long local_58 [4];
  jas_image_t *local_38;
  
  local_38 = image;
  local_a4 = pnm_fmt((long)hdr->magic);
  iVar5 = pnm_type((long)hdr->magic);
  if (iVar5 == 0) {
    __assert_fail("type != PNM_TYPE_INVALID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/pnm/pnm_dec.c"
                  ,0x16f,"int pnm_getdata(jas_stream_t *, pnm_hdr_t *, jas_image_t *, int)");
  }
  iVar6 = pnm_maxvaltodepth((long)hdr->maxval);
  local_80 = CONCAT44(extraout_var,iVar6);
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  if (0 < hdr->numcmpts) {
    lVar13 = 0;
    do {
      pjVar8 = jas_matrix_create(1,(long)hdr->width);
      local_58[lVar13] = (long)pjVar8;
      if (pjVar8 == (jas_matrix_t *)0x0) {
        piVar11 = &hdr->numcmpts;
        lVar13 = 0xffffffff;
        goto LAB_00134bf4;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < hdr->numcmpts);
  }
  piVar11 = &hdr->numcmpts;
  if (hdr->height < 1) {
    lVar13 = 0;
  }
  else {
    local_58[3] = (long)(1 << ((char)local_80 - 1U & 0x1f));
    local_70 = 0;
    local_88 = local_58[0];
    local_64 = iVar5;
    do {
      uVar10 = local_a0;
      if (local_64 == 1) {
        if (local_a4 == 1) {
          if (0 < hdr->width) {
            lVar14 = 0;
            lVar13 = local_88;
            do {
              uVar7 = 0xffffffff;
              if ((in->flags_ & 7U) == 0) {
                if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
                  iVar5 = in->cnt_;
                  in->cnt_ = iVar5 + -1;
                  if (iVar5 < 1) {
                    uVar7 = jas_stream_fillbuf(in,1);
                    lVar13 = local_88;
                  }
                  else {
                    in->rwcnt_ = in->rwcnt_ + 1;
                    pbVar2 = in->ptr_;
                    in->ptr_ = pbVar2 + 1;
                    uVar7 = (uint)*pbVar2;
                  }
                }
                else {
                  in->flags_ = in->flags_ | 4;
                  uVar7 = 0xffffffff;
                }
              }
              if (uVar7 == 0xffffffff) goto LAB_00134bee;
              iVar5 = hdr->width;
              lVar14 = (long)(int)lVar14;
              iVar6 = 8;
              do {
                if (iVar5 <= lVar14) break;
                *(ulong *)(**(long **)(lVar13 + 0x38) + lVar14 * 8) = (ulong)(-1 < (char)uVar7);
                uVar7 = uVar7 * 2;
                lVar14 = lVar14 + 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != 0);
              uVar10 = local_a0;
            } while ((int)lVar14 < hdr->width);
          }
        }
        else if (0 < hdr->width) {
          lVar13 = 0;
LAB_00134ae1:
          do {
            while (uVar7 = pnm_getc(in), uVar7 == 0x23) {
              do {
                iVar5 = pnm_getc(in);
                if (iVar5 == -1) goto LAB_00134b1c;
              } while (iVar5 != 10);
            }
            if (uVar7 == 0xffffffff) {
LAB_00134b1c:
              bVar3 = false;
            }
            else {
              if ((uVar7 & 0xfffffffe) != 0x30) goto LAB_00134ae1;
              local_68 = uVar7 - 0x30;
              bVar3 = true;
            }
            iVar5 = 5;
            if (bVar3) {
              *(long *)(**(long **)(local_88 + 0x38) + lVar13 * 8) = (long)(1 - local_68);
              iVar5 = 0;
            }
            if (iVar5 != 0) {
              if (iVar5 != 5) goto LAB_00134c18;
              goto LAB_00134bee;
            }
            lVar13 = lVar13 + 1;
            uVar10 = local_a0;
          } while (lVar13 < hdr->width);
        }
      }
      else if (0 < hdr->width) {
        local_78 = 0;
        local_60 = piVar11;
        do {
          if (0 < *piVar11) {
            lVar13 = 0;
            do {
              if (local_a4 == 1) {
                if (hdr->sgnd == true) {
                  iVar5 = pnm_getuint(in,(int)local_80,&local_b0);
                  if (iVar5 == 0) {
                    if ((local_58[3] & local_b0) != 0) {
                      jas_eprintf("PNM decoder does not fully support signed data\n");
                      goto LAB_001349bb;
                    }
                    bVar12 = 1;
                    local_98 = local_b0;
                  }
                  else {
LAB_001349bb:
                    bVar12 = 0;
                  }
                  if (bVar12 != 0) {
                    uVar10 = local_98;
                  }
                  if (allow_trunc == 0 || bVar12 != 0) {
                    cVar4 = (bVar12 ^ 1) * '\x05';
                  }
                  else {
                    local_98 = 0;
                    jas_eprintf("bad sample data\n");
                    cVar4 = '\0';
                    uVar10 = 0;
                  }
                }
                else {
                  iVar5 = pnm_getuint(in,(int)local_80,&local_b0);
                  if (iVar5 == 0) goto LAB_00134984;
                  if (allow_trunc != 0) goto LAB_0013496d;
                  cVar4 = '\x05';
                }
              }
              else {
                local_a0 = uVar10;
                if (hdr->sgnd == false) {
                  do {
                    iVar5 = pnm_getc(in);
                    if (iVar5 == -1) {
                      bVar12 = 0;
                      goto LAB_00134a2d;
                    }
                    ppuVar9 = __ctype_b_loc();
                  } while ((*(byte *)((long)*ppuVar9 + (long)iVar5 * 2 + 1) & 0x20) != 0);
                  uVar10 = 0;
                  do {
                    uVar1 = (*ppuVar9)[iVar5];
                    if ((uVar1 >> 0xb & 1) == 0) {
                      bVar12 = (byte)(uVar1 >> 0xd) & 1;
                      piVar11 = local_60;
                      if ((uVar1 >> 0xd & 1) != 0) {
                        local_90 = uVar10;
                      }
                      goto LAB_00134a2d;
                    }
                    uVar10 = ((long)iVar5 + uVar10 * 10) - 0x30;
                    iVar5 = pnm_getc(in);
                  } while (-1 < iVar5);
                  bVar12 = 0;
                  piVar11 = local_60;
LAB_00134a2d:
                  uVar10 = local_a0;
                  if (bVar12 != 0) {
                    uVar10 = local_90;
                  }
                  if (allow_trunc == 0 || bVar12 != 0) {
                    cVar4 = (bVar12 ^ 1) * '\x05';
                  }
                  else {
                    local_90 = 0;
                    jas_eprintf("bad sample data\n");
                    uVar10 = 0;
                    cVar4 = '\0';
                  }
                }
                else {
                  iVar5 = pnm_getsintstr(in,(int_fast32_t *)&local_b0);
                  if (iVar5 != 0) {
                    if (allow_trunc == 0) {
                      cVar4 = '\x05';
                      uVar10 = local_a0;
                      goto joined_r0x00134a0d;
                    }
LAB_0013496d:
                    jas_eprintf("bad sample data\n");
                    local_b0 = 0;
                  }
LAB_00134984:
                  cVar4 = '\0';
                  uVar10 = local_b0;
                }
              }
joined_r0x00134a0d:
              if (cVar4 != '\0') {
                lVar13 = 0xffffffff;
                if (cVar4 != '\x05') goto LAB_00134c18;
                goto LAB_00134bf4;
              }
              *(ulong *)(**(long **)(local_58[lVar13] + 0x38) + local_78 * 8) = uVar10;
              lVar13 = lVar13 + 1;
            } while (lVar13 < *piVar11);
          }
          local_78 = local_78 + 1;
        } while (local_78 < hdr->width);
      }
      local_a0 = uVar10;
      if (0 < *piVar11) {
        lVar13 = 0;
        do {
          iVar5 = jas_image_writecmpt(local_38,(uint)lVar13,0,local_70,(long)hdr->width,1,
                                      (jas_matrix_t *)local_58[lVar13]);
          if (iVar5 != 0) goto LAB_00134bee;
          lVar13 = lVar13 + 1;
        } while (lVar13 < *piVar11);
      }
      local_70 = local_70 + 1;
      lVar13 = 0;
    } while (local_70 < hdr->height);
  }
LAB_00134bf4:
  if (0 < *piVar11) {
    lVar14 = 0;
    do {
      if ((jas_matrix_t *)local_58[lVar14] != (jas_matrix_t *)0x0) {
        jas_matrix_destroy((jas_matrix_t *)local_58[lVar14]);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < *piVar11);
  }
LAB_00134c18:
  return (int)lVar13;
LAB_00134bee:
  lVar13 = 0xffffffff;
  goto LAB_00134bf4;
}

Assistant:

static int pnm_getdata(jas_stream_t *in, pnm_hdr_t *hdr, jas_image_t *image,
  int allow_trunc)
{
	int ret;
#if 0
	int numcmpts;
#endif
	int cmptno;
	int fmt;
	jas_matrix_t *data[3];
	int x;
	int y;
	int_fast64_t v;
	int depth;
	int type;
	int c;
	int n;

	ret = -1;

#if 0
	numcmpts = jas_image_numcmpts(image);
#endif
	fmt = pnm_fmt(hdr->magic);
	type = pnm_type(hdr->magic);
	assert(type != PNM_TYPE_INVALID);
	depth = pnm_maxvaltodepth(hdr->maxval);

	data[0] = 0;
	data[1] = 0;
	data[2] = 0;
	for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
		if (!(data[cmptno] = jas_matrix_create(1, hdr->width))) {
			goto done;
		}
	}

	for (y = 0; y < hdr->height; ++y) {
		if (type == PNM_TYPE_PBM) {
			if (fmt == PNM_FMT_BIN) {
				for (x = 0; x < hdr->width;) {
					if ((c = jas_stream_getc(in)) == EOF) {
						goto done;
					}
					n = 8;
					while (n > 0 && x < hdr->width) {
						jas_matrix_set(data[0], 0, x, 1 - ((c >> 7) & 1));
						c <<= 1;
						--n;
						++x;
					}
				}
			} else {
				for (x = 0; x < hdr->width; ++x) {
					int uv;
					if (pnm_getbitstr(in, &uv)) {
						goto done;
					}
					jas_matrix_set(data[0], 0, x, 1 - uv);
				}
			}
		} else {
			for (x = 0; x < hdr->width; ++x) {
				for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
					if (fmt == PNM_FMT_BIN) {
						/* The sample data is in binary format. */
						if (hdr->sgnd) {
							/* The sample data is signed. */
							int_fast32_t sv;
							if (pnm_getsint(in, depth, &sv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								sv = 0;
							}
							v = sv;
						} else {
							/* The sample data is unsigned. */
							uint_fast32_t uv;
							if (pnm_getuint(in, depth, &uv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								uv = 0;
							}
							v = uv;
						}
					} else {
						/* The sample data is in text format. */
						if (hdr->sgnd) {
							/* The sample data is signed. */
							int_fast32_t sv;
							if (pnm_getsintstr(in, &sv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								sv = 0;
							}
							v = sv;
						} else {
							/* The sample data is unsigned. */
							uint_fast32_t uv;
							if (pnm_getuintstr(in, &uv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								uv = 0;
							}
							v = uv;
						}
					}
					jas_matrix_set(data[cmptno], 0, x, v);
				}
			}
		}
		for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
			if (jas_image_writecmpt(image, cmptno, 0, y, hdr->width, 1,
			  data[cmptno])) {
				goto done;
			}
		}
	}

	ret = 0;

done:

	for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
		if (data[cmptno]) {
			jas_matrix_destroy(data[cmptno]);
		}
	}

	return ret;
}